

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::ArenaTest_SpaceAllocated_and_Used_Test::TestBody
          (ArenaTest_SpaceAllocated_and_Used_Test *this)

{
  char *pcVar1;
  AssertHelper local_1c0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1b8;
  AssertionResult gtest_ar_6;
  vector<char,_std::allocator<char>_> arena_block;
  ArenaOptions local_188;
  Arena arena_2;
  Arena arena_1;
  
  internal::ThreadSafeArena::ThreadSafeArena(&arena_1.impl_);
  arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_ << 0x20);
  local_188.start_block_size = internal::ThreadSafeArena::SpaceAllocated(&arena_1.impl_);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&arena_2,"0","arena_1.SpaceAllocated()",(int *)&arena_block,
             &local_188.start_block_size);
  if ((char)arena_2.impl_.tag_and_id_ == '\0') {
    testing::Message::Message((Message *)&local_188);
    if (arena_2.impl_.alloc_policy_.policy_ == 0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)arena_2.impl_.alloc_policy_.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&arena_block,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x672,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&arena_block,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&arena_block);
    if ((long *)local_188.start_block_size != (long *)0x0) {
      (**(code **)(*(long *)local_188.start_block_size + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&arena_2.impl_.alloc_policy_);
  arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_188.start_block_size = internal::ThreadSafeArena::SpaceUsed(&arena_1.impl_);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&arena_2,"0","arena_1.SpaceUsed()",(int *)&arena_block,
             &local_188.start_block_size);
  if ((char)arena_2.impl_.tag_and_id_ == '\0') {
    testing::Message::Message((Message *)&local_188);
    if (arena_2.impl_.alloc_policy_.policy_ == 0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)arena_2.impl_.alloc_policy_.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&arena_block,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x673,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&arena_block,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&arena_block);
    if ((long *)local_188.start_block_size != (long *)0x0) {
      (**(code **)(*(long *)local_188.start_block_size + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&arena_2.impl_.alloc_policy_);
  arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_188.start_block_size = internal::ThreadSafeArena::Reset(&arena_1.impl_);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&arena_2,"0","arena_1.Reset()",(int *)&arena_block,
             &local_188.start_block_size);
  if ((char)arena_2.impl_.tag_and_id_ == '\0') {
    testing::Message::Message((Message *)&local_188);
    if (arena_2.impl_.alloc_policy_.policy_ == 0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)arena_2.impl_.alloc_policy_.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&arena_block,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x674,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&arena_block,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&arena_block);
    if ((long *)local_188.start_block_size != (long *)0x0) {
      (**(code **)(*(long *)local_188.start_block_size + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&arena_2.impl_.alloc_policy_);
  Arena::CreateArray<char>(&arena_1,0x140);
  arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,0x140);
  local_188.start_block_size = internal::ThreadSafeArena::SpaceAllocated(&arena_1.impl_);
  testing::internal::CmpHelperLE<int,unsigned_long>
            ((internal *)&arena_2,"320","arena_1.SpaceAllocated()",(int *)&arena_block,
             &local_188.start_block_size);
  if ((char)arena_2.impl_.tag_and_id_ == '\0') {
    testing::Message::Message((Message *)&local_188);
    if (arena_2.impl_.alloc_policy_.policy_ == 0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)arena_2.impl_.alloc_policy_.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&arena_block,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x677,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&arena_block,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&arena_block);
    if ((long *)local_188.start_block_size != (long *)0x0) {
      (**(code **)(*(long *)local_188.start_block_size + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&arena_2.impl_.alloc_policy_);
  local_188.start_block_size = 0x140;
  arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)internal::ThreadSafeArena::SpaceUsed(&arena_1.impl_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&arena_2,"Align8(320)","arena_1.SpaceUsed()",&local_188.start_block_size,
             (unsigned_long *)&arena_block);
  if ((char)arena_2.impl_.tag_and_id_ == '\0') {
    testing::Message::Message((Message *)&local_188);
    if (arena_2.impl_.alloc_policy_.policy_ == 0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)arena_2.impl_.alloc_policy_.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&arena_block,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x678,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&arena_block,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&arena_block);
    if ((long *)local_188.start_block_size != (long *)0x0) {
      (**(code **)(*(long *)local_188.start_block_size + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&arena_2.impl_.alloc_policy_);
  arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,0x140);
  local_188.start_block_size = internal::ThreadSafeArena::Reset(&arena_1.impl_);
  testing::internal::CmpHelperLE<int,unsigned_long>
            ((internal *)&arena_2,"320","arena_1.Reset()",(int *)&arena_block,
             &local_188.start_block_size);
  if ((char)arena_2.impl_.tag_and_id_ == '\0') {
    testing::Message::Message((Message *)&local_188);
    if (arena_2.impl_.alloc_policy_.policy_ == 0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)arena_2.impl_.alloc_policy_.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&arena_block,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x679,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&arena_block,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&arena_block);
    if ((long *)local_188.start_block_size != (long *)0x0) {
      (**(code **)(*(long *)local_188.start_block_size + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&arena_2.impl_.alloc_policy_);
  std::vector<char,_std::allocator<char>_>::vector(&arena_block,0x400,(allocator_type *)&arena_2);
  local_188.block_alloc = (_func_void_ptr_size_t *)0x0;
  local_188.block_dealloc = (_func_void_void_ptr_size_t *)0x0;
  local_188.start_block_size = 0x100;
  local_188.max_block_size = 0x2000;
  local_188.initial_block =
       arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_188.initial_block_size =
       (long)arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  Arena::Arena(&arena_2,&local_188);
  local_1c0.data_._0_4_ = 0x400;
  local_1b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       internal::ThreadSafeArena::SpaceAllocated(&arena_2.impl_);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_6,"1024","arena_2.SpaceAllocated()",(int *)&local_1c0,
             (unsigned_long *)&local_1b8);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&local_1b8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)gtest_ar_6.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x683,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_6.message_);
  local_1c0.data_ = local_1c0.data_ & 0xffffffff00000000;
  local_1b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       internal::ThreadSafeArena::SpaceUsed(&arena_2.impl_);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_6,"0","arena_2.SpaceUsed()",(int *)&local_1c0,
             (unsigned_long *)&local_1b8);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&local_1b8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)gtest_ar_6.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x684,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_6.message_);
  local_1c0.data_._0_4_ = 0x400;
  local_1b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       internal::ThreadSafeArena::Reset(&arena_2.impl_);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_6,"1024","arena_2.Reset()",(int *)&local_1c0,
             (unsigned_long *)&local_1b8);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&local_1b8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)gtest_ar_6.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x685,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_6.message_);
  Arena::CreateArray<char>(&arena_2,0x37);
  local_1c0.data_._0_4_ = 0x400;
  local_1b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       internal::ThreadSafeArena::SpaceAllocated(&arena_2.impl_);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_6,"1024","arena_2.SpaceAllocated()",(int *)&local_1c0,
             (unsigned_long *)&local_1b8);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&local_1b8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)gtest_ar_6.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x687,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_6.message_);
  local_1b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x38;
  local_1c0.data_ = (AssertHelperData *)internal::ThreadSafeArena::SpaceUsed(&arena_2.impl_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_6,"Align8(55)","arena_2.SpaceUsed()",(unsigned_long *)&local_1b8,
             (unsigned_long *)&local_1c0);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&local_1b8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)gtest_ar_6.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x688,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_6.message_);
  local_1c0.data_._0_4_ = 0x400;
  local_1b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       internal::ThreadSafeArena::Reset(&arena_2.impl_);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_6,"1024","arena_2.Reset()",(int *)&local_1c0,
             (unsigned_long *)&local_1b8);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&local_1b8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)gtest_ar_6.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x689,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_6.message_);
  internal::ThreadSafeArena::~ThreadSafeArena(&arena_2.impl_);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&arena_block.super__Vector_base<char,_std::allocator<char>_>);
  internal::ThreadSafeArena::~ThreadSafeArena(&arena_1.impl_);
  return;
}

Assistant:

TEST(ArenaTest, SpaceAllocated_and_Used) {
  Arena arena_1;
  EXPECT_EQ(0, arena_1.SpaceAllocated());
  EXPECT_EQ(0, arena_1.SpaceUsed());
  EXPECT_EQ(0, arena_1.Reset());
  Arena::CreateArray<char>(&arena_1, 320);
  // Arena will allocate slightly more than 320 for the block headers.
  EXPECT_LE(320, arena_1.SpaceAllocated());
  EXPECT_EQ(Align8(320), arena_1.SpaceUsed());
  EXPECT_LE(320, arena_1.Reset());

  // Test with initial block.
  std::vector<char> arena_block(1024);
  ArenaOptions options;
  options.start_block_size = 256;
  options.max_block_size = 8192;
  options.initial_block = &arena_block[0];
  options.initial_block_size = arena_block.size();
  Arena arena_2(options);
  EXPECT_EQ(1024, arena_2.SpaceAllocated());
  EXPECT_EQ(0, arena_2.SpaceUsed());
  EXPECT_EQ(1024, arena_2.Reset());
  Arena::CreateArray<char>(&arena_2, 55);
  EXPECT_EQ(1024, arena_2.SpaceAllocated());
  EXPECT_EQ(Align8(55), arena_2.SpaceUsed());
  EXPECT_EQ(1024, arena_2.Reset());
}